

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_float.h
# Opt level: O1

adjusted_mantissa
duckdb_fast_float::compute_float<duckdb_fast_float::binary_format<double>>(decimal *d)

{
  uint8_t *puVar1;
  ulong extraout_RAX;
  byte bVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  uint32_t shift;
  uint8_t uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  uint8_t *puVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  double __x;
  adjusted_mantissa aVar19;
  
  if ((d->num_digits != 0) && (-0x145 < d->decimal_point)) {
    uVar6 = 0x7ff;
    uVar17 = 0;
    uVar5 = uVar6;
    if (0x135 < d->decimal_point) goto LAB_01282a36;
    puVar1 = d->digits;
    do {
      uVar8 = d->decimal_point;
      if ((long)(int)uVar8 < 1) {
        uVar5 = 0;
        goto LAB_01282bcd;
      }
      uVar3 = 0x3c;
      if (uVar8 < 0x13) {
        uVar3 = (uint)""[(int)uVar8];
      }
      uVar14 = d->num_digits;
      uVar5 = 0;
      uVar16 = 0;
      do {
        bVar2 = (byte)uVar3;
        if (uVar14 == (uint)uVar16) {
          if (uVar5 == 0) goto LAB_01282ba4;
          if (uVar5 >> (bVar2 & 0x3f) == 0) {
            uVar11 = (ulong)uVar14;
            do {
              uVar5 = uVar5 * 10;
              uVar11 = (ulong)((int)uVar11 + 1);
            } while (uVar5 >> (bVar2 & 0x3f) == 0);
          }
          else {
            uVar11 = (ulong)uVar14;
          }
          break;
        }
        uVar11 = (ulong)((uint)uVar16 + 1);
        uVar5 = (ulong)puVar1[uVar16] + uVar5 * 10;
        uVar16 = uVar11;
      } while (uVar5 >> (bVar2 & 0x3f) == 0);
      uVar12 = (uint)uVar11;
      iVar9 = (uVar8 - uVar12) + 1;
      d->decimal_point = iVar9;
      if (iVar9 < -0x7ff) {
        d->negative = false;
        d->truncated = false;
        d->num_digits = 0;
        d->decimal_point = 0;
      }
      else {
        uVar10 = ~(-1L << (bVar2 & 0x3f));
        uVar16 = 0;
        uVar8 = uVar14 - uVar12;
        uVar13 = (ulong)uVar8;
        puVar15 = puVar1;
        if (uVar12 <= uVar14 && uVar8 != 0) {
          do {
            uVar16 = uVar5 >> (bVar2 & 0x3f);
            uVar5 = (uVar5 & uVar10) * 10 + (ulong)puVar15[uVar11];
            *puVar15 = (uint8_t)uVar16;
            uVar13 = uVar13 - 1;
            puVar15 = puVar15 + 1;
          } while (uVar13 != 0);
          uVar16 = (ulong)uVar8;
        }
        for (; uVar8 = (uint)uVar16, uVar5 != 0; uVar5 = (uVar5 & uVar10) * 10) {
          uVar7 = (uint8_t)(uVar5 >> (bVar2 & 0x3f));
          if (uVar8 < 0x300) {
            puVar1[uVar16] = uVar7;
            uVar16 = (ulong)(uVar8 + 1);
          }
          else if (uVar7 != '\0') {
            d->truncated = true;
          }
        }
        d->num_digits = uVar8;
        if (uVar8 != 0) {
          uVar16 = uVar16 - 1;
          do {
            if (puVar1[uVar16 & 0xffffffff] != '\0') break;
            d->num_digits = (uint32_t)uVar16;
            uVar16 = uVar16 - 1;
          } while ((int)uVar16 != -1);
        }
      }
LAB_01282ba4:
      if (d->decimal_point < -0x7ff) {
        uVar3 = 0;
      }
      uVar17 = (ulong)(uVar3 + (int)uVar17);
    } while (-0x800 < d->decimal_point);
  }
  uVar6 = 0;
LAB_01282a33:
  uVar17 = 0;
  uVar5 = uVar6;
  goto LAB_01282a36;
code_r0x01282c70:
  uVar16 = (ulong)((uint)uVar17 + 1);
  uVar5 = (ulong)puVar1[uVar17] + uVar5 * 10;
  uVar17 = uVar16;
  if (uVar5 >> (bVar2 & 0x3f) != 0) goto LAB_01282c90;
  goto LAB_01282c6b;
LAB_01282bcd:
  do {
    iVar4 = (int)uVar17;
    iVar9 = d->decimal_point;
    if (0 < iVar9) goto LAB_01282c38;
    if (iVar9 == 0) {
      iVar9 = 5;
      if (d->digits[0] < 5) {
        shift = (d->digits[0] < 2) + 1;
        goto LAB_01282c05;
      }
    }
    else {
      shift = 0x3c;
      if ((uint)-iVar9 < 0x13) {
        shift = (uint32_t)""[(uint)-iVar9];
      }
LAB_01282c05:
      detail::decimal_left_shift(d,shift);
      if (d->decimal_point < 0x800) {
        uVar17 = (ulong)(iVar4 - shift);
        iVar9 = 0;
      }
      else {
        iVar9 = 1;
        uVar5 = 0x7ff;
      }
    }
    iVar4 = (int)uVar17;
  } while (iVar9 == 0);
  if (iVar9 != 5) {
    uVar17 = 0;
    goto LAB_01282a36;
  }
LAB_01282c38:
  iVar9 = iVar4 + -1;
  if (iVar4 < -0x3fd) {
    puVar1 = d->digits;
    do {
      uVar8 = -iVar9 - 0x3feU;
      if (0x3b < -iVar9 - 0x3feU) {
        uVar8 = 0x3c;
      }
      uVar3 = d->num_digits;
      uVar5 = 0;
      uVar17 = 0;
LAB_01282c6b:
      bVar2 = (byte)uVar8;
      if (uVar3 != (uint)uVar17) goto code_r0x01282c70;
      if (uVar5 == 0) goto LAB_01282d90;
      uVar17 = uVar5 >> (bVar2 & 0x3f);
      uVar14 = uVar3;
      while (uVar16 = (ulong)uVar14, uVar17 == 0) {
        uVar5 = uVar5 * 10;
        uVar14 = uVar14 + 1;
        uVar17 = uVar5 >> (bVar2 & 0x3f);
      }
LAB_01282c90:
      uVar14 = (uint)uVar16;
      iVar4 = (d->decimal_point - uVar14) + 1;
      d->decimal_point = iVar4;
      if (iVar4 < -0x7ff) {
        d->negative = false;
        d->truncated = false;
        d->num_digits = 0;
        d->decimal_point = 0;
      }
      else {
        uVar10 = ~(-1L << (bVar2 & 0x3f));
        uVar17 = 0;
        uVar12 = uVar3 - uVar14;
        uVar13 = (ulong)uVar12;
        puVar15 = puVar1;
        uVar11 = uVar5;
        if (uVar14 <= uVar3 && uVar12 != 0) {
          do {
            uVar17 = uVar5 >> (bVar2 & 0x3f);
            uVar5 = (ulong)puVar15[uVar16] + (uVar5 & uVar10) * 10;
            *puVar15 = (uint8_t)uVar17;
            uVar13 = uVar13 - 1;
            puVar15 = puVar15 + 1;
          } while (uVar13 != 0);
          uVar17 = (ulong)uVar12;
          uVar11 = uVar5;
        }
        while (uVar3 = (uint)uVar17, uVar11 != 0) {
          uVar7 = (uint8_t)(uVar5 >> (bVar2 & 0x3f));
          if (uVar3 < 0x300) {
            puVar1[uVar17] = uVar7;
            uVar17 = (ulong)(uVar3 + 1);
          }
          else if (uVar7 != '\0') {
            d->truncated = true;
          }
          uVar11 = uVar5 & uVar10;
          uVar5 = uVar11 * 10;
        }
        d->num_digits = uVar3;
        if (uVar3 != 0) {
          uVar17 = uVar17 - 1;
          do {
            if (puVar1[uVar17 & 0xffffffff] != '\0') break;
            d->num_digits = (uint32_t)uVar17;
            uVar17 = uVar17 - 1;
          } while ((int)uVar17 != -1);
        }
      }
LAB_01282d90:
      iVar9 = uVar8 + iVar9;
      if (-0x3ff < iVar9) break;
    } while( true );
  }
  if (0x3ff < iVar9) goto LAB_01282a33;
  detail::decimal_left_shift(d,0x35);
  uVar8 = d->num_digits;
  if ((ulong)uVar8 == 0) {
LAB_01282e1a:
    uVar17 = 0;
  }
  else {
    uVar3 = d->decimal_point;
    uVar5 = (ulong)uVar3;
    if ((int)uVar3 < 0) goto LAB_01282e1a;
    uVar17 = 0xffffffffffffffff;
    if ((int)uVar3 < 0x13) {
      if (uVar5 == 0) {
        lVar18 = 0;
      }
      else {
        uVar17 = 0;
        lVar18 = 0;
        do {
          if (uVar17 < uVar8) {
            uVar16 = (ulong)d->digits[uVar17];
          }
          else {
            uVar16 = 0;
          }
          lVar18 = lVar18 * 10 + uVar16;
          uVar17 = uVar17 + 1;
        } while (uVar5 != uVar17);
      }
      if (uVar3 < uVar8) {
        uVar14 = (uint)(4 < d->digits[uVar5]);
        if ((uVar3 + 1 == uVar8 && d->digits[uVar5] == 5) &&
           (uVar14 = (uint)d->truncated, uVar5 != 0 && d->truncated == false)) {
          uVar14 = (uint)d->digits[uVar3 - 1];
        }
      }
      else {
        uVar14 = 0;
      }
      uVar17 = lVar18 + (ulong)(uVar14 & 1);
    }
  }
  if (uVar17 >> 0x35 != 0) {
    detail::decimal_right_shift(d,1);
    detail::round(__x);
    if (iVar9 == 0x3ff) goto LAB_01282a33;
    iVar9 = iVar9 + 1;
    uVar17 = extraout_RAX;
  }
  uVar5 = (ulong)((0x3ff - (uint)(uVar17 < 0x10000000000000)) + iVar9);
  uVar17 = uVar17 & 0xfffffffffffff;
LAB_01282a36:
  aVar19._8_8_ = uVar5;
  aVar19.mantissa = uVar17;
  return aVar19;
}

Assistant:

adjusted_mantissa compute_float(decimal &d) {
  adjusted_mantissa answer;
  if (d.num_digits == 0) {
    // should be zero
    answer.power2 = 0;
    answer.mantissa = 0;
    return answer;
  }
  // At this point, going further, we can assume that d.num_digits > 0.
  //
  // We want to guard against excessive decimal point values because
  // they can result in long running times. Indeed, we do
  // shifts by at most 60 bits. We have that log(10**400)/log(2**60) ~= 22
  // which is fine, but log(10**299995)/log(2**60) ~= 16609 which is not
  // fine (runs for a long time).
  //
  if(d.decimal_point < -324) {
    // We have something smaller than 1e-324 which is always zero
    // in binary64 and binary32.
    // It should be zero.
    answer.power2 = 0;
    answer.mantissa = 0;
    return answer;
  } else if(d.decimal_point >= 310) {
    // We have something at least as large as 0.1e310 which is
    // always infinite.  
    answer.power2 = binary::infinite_power();
    answer.mantissa = 0;
    return answer;
  }
  static const uint32_t max_shift = 60;
  static const uint32_t num_powers = 19;
  static const uint8_t decimal_powers[19] = {
      0,  3,  6,  9,  13, 16, 19, 23, 26, 29, //
      33, 36, 39, 43, 46, 49, 53, 56, 59,     //
  };
  int32_t exp2 = 0;
  while (d.decimal_point > 0) {
    uint32_t n = uint32_t(d.decimal_point);
    uint32_t shift = (n < num_powers) ? decimal_powers[n] : max_shift;
    detail::decimal_right_shift(d, shift);
    if (d.decimal_point < -decimal_point_range) {
      // should be zero
      answer.power2 = 0;
      answer.mantissa = 0;
      return answer;
    }
    exp2 += int32_t(shift);
  }
  // We shift left toward [1/2 ... 1].
  while (d.decimal_point <= 0) {
    uint32_t shift;
    if (d.decimal_point == 0) {
      if (d.digits[0] >= 5) {
        break;
      }
      shift = (d.digits[0] < 2) ? 2 : 1;
    } else {
      uint32_t n = uint32_t(-d.decimal_point);
      shift = (n < num_powers) ? decimal_powers[n] : max_shift;
    }
    detail::decimal_left_shift(d, shift);
    if (d.decimal_point > decimal_point_range) {
      // we want to get infinity:
      answer.power2 = binary::infinite_power();
      answer.mantissa = 0;
      return answer;
    }
    exp2 -= int32_t(shift);
  }
  // We are now in the range [1/2 ... 1] but the binary format uses [1 ... 2].
  exp2--;
  constexpr int32_t minimum_exponent = binary::minimum_exponent();
  while ((minimum_exponent + 1) > exp2) {
    uint32_t n = uint32_t((minimum_exponent + 1) - exp2);
    if (n > max_shift) {
      n = max_shift;
    }
    detail::decimal_right_shift(d, n);
    exp2 += int32_t(n);
  }
  if ((exp2 - minimum_exponent) >= binary::infinite_power()) {
    answer.power2 = binary::infinite_power();
    answer.mantissa = 0;
    return answer;
  }

  const int mantissa_size_in_bits = binary::mantissa_explicit_bits() + 1;
  detail::decimal_left_shift(d, mantissa_size_in_bits);

  uint64_t mantissa = detail::round(d);
  // It is possible that we have an overflow, in which case we need
  // to shift back.
  if(mantissa >= (uint64_t(1) << mantissa_size_in_bits)) {
    detail::decimal_right_shift(d, 1);
    exp2 += 1;
    mantissa = detail::round(d);
    if ((exp2 - minimum_exponent) >= binary::infinite_power()) {
      answer.power2 = binary::infinite_power();
      answer.mantissa = 0;
      return answer;
    }
  }
  answer.power2 = exp2  - binary::minimum_exponent();
  if(mantissa < (uint64_t(1) << binary::mantissa_explicit_bits())) { answer.power2--; }
  answer.mantissa = mantissa & ((uint64_t(1) << binary::mantissa_explicit_bits()) - 1);
  return answer;
}